

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O1

EStatusCode __thiscall
PDFDocumentHandler::OnResourcesWrite
          (PDFDocumentHandler *this,ResourcesDictionary *inResources,
          DictionaryContext *inPageResourcesDictionaryContext,
          ObjectsContext *inPDFWriterObjectContext,DocumentContext *inPDFWriterDocumentContext)

{
  undefined8 ****ppppuVar1;
  bool bVar2;
  undefined8 ****ppppuVar3;
  iteratorType iVar4;
  EStatusCode EVar5;
  PDFObject *inOriginal;
  string *inKey;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  it;
  PDFObjectCastPtr<PDFDictionary> resources;
  ObjectIDTypeList dummyObjectList;
  OutWritingPolicy writingPolicy;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  local_88;
  RefCountPtr<PDFDictionary> local_70;
  undefined8 ***local_60;
  undefined8 ***local_58;
  undefined8 local_50;
  IObjectWritePolicy local_48;
  PDFDocumentHandler *local_40;
  undefined8 ***local_38;
  
  inOriginal = FindPageResources(this,this->mParser,this->mWrittenPage);
  local_70.mValue = PDFObjectCast<PDFDictionary>(inOriginal);
  local_70._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a97b0;
  local_50 = 0;
  local_60 = &local_60;
  local_58 = &local_60;
  if (local_70.mValue != (PDFDictionary *)0x0) {
    PDFDictionary::GetIterator(&local_88,local_70.mValue);
    local_48._vptr_IObjectWritePolicy = (_func_int **)&PTR_WriteReference_003ac030;
    EVar5 = eSuccess;
    local_40 = this;
    local_38 = &local_60;
    do {
      iVar4._M_node =
           local_88.
           super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
           .mEndPosition._M_node;
      if (local_88.
          super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
          .mCurrentPosition._M_node ==
          local_88.
          super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
          .mEndPosition._M_node) {
LAB_001ca0f7:
        bVar2 = false;
      }
      else {
        if (local_88.
            super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
            .mFirstMove == true) {
          local_88.
          super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
          .mFirstMove = false;
        }
        else {
          local_88.
          super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
          .mCurrentPosition._M_node =
               (_Base_ptr)
               std::_Rb_tree_increment
                         (local_88.
                          super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                          .mCurrentPosition._M_node);
          if (local_88.
              super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
              .mCurrentPosition._M_node == iVar4._M_node) goto LAB_001ca0f7;
        }
        bVar2 = true;
      }
      ppppuVar3 = (undefined8 ****)local_60;
      if ((EVar5 != eSuccess) || (!bVar2)) goto joined_r0x001ca147;
      inKey = PDFName::GetValue_abi_cxx11_
                        (*(PDFName **)
                          (local_88.
                           super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                           .mCurrentPosition._M_node + 1));
      EVar5 = DictionaryContext::WriteKey(inPageResourcesDictionaryContext,inKey);
      if (EVar5 == eSuccess) {
        EVar5 = WriteObjectByType(this,(PDFObject *)
                                       local_88.
                                       super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                       .mCurrentPosition._M_node[1]._M_parent,eTokenSeparatorEndLine
                                  ,&local_48);
      }
    } while( true );
  }
  EVar5 = eSuccess;
  ppppuVar3 = &local_60;
joined_r0x001ca147:
  while (ppppuVar3 != &local_60) {
    ppppuVar1 = (undefined8 ****)*ppppuVar3;
    operator_delete(ppppuVar3,0x18);
    ppppuVar3 = ppppuVar1;
  }
  RefCountPtr<PDFDictionary>::~RefCountPtr(&local_70);
  return EVar5;
}

Assistant:

EStatusCode PDFDocumentHandler::OnResourcesWrite(
						ResourcesDictionary* inResources,
						DictionaryContext* inPageResourcesDictionaryContext,
						ObjectsContext* inPDFWriterObjectContext,
						DocumentContext* inPDFWriterDocumentContext)
{
	// Writing resources dictionary. simply loop internal elements and copy. nicely enough, i can use read methods, trusting
	// that no new objects need be written
	
	PDFObjectCastPtr<PDFDictionary> resources(FindPageResources(mParser, mWrittenPage));
	ObjectIDTypeList dummyObjectList; // this one should remain empty...

	// k. no resources...as wierd as that might be...or just wrong...i'll let it be
	if(!resources)
		return PDFHummus::eSuccess;

	MapIterator<PDFNameToPDFObjectMap> it(resources->GetIterator());
	EStatusCode status = PDFHummus::eSuccess;
	OutWritingPolicy writingPolicy(this, dummyObjectList);

	while(it.MoveNext() && PDFHummus::eSuccess == status)
	{
		status = inPageResourcesDictionaryContext->WriteKey(it.GetKey()->GetValue());
		if(PDFHummus::eSuccess == status)
			status = WriteObjectByType(it.GetValue(),eTokenSeparatorEndLine, &writingPolicy);
	}
	return status;
}